

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

Matrix * __thiscall lunasvg::Element::getGlobalMatrix(Matrix *__return_storage_ptr__,Element *this)

{
  SVGElement *pSVar1;
  Transform local_48;
  SVGElement *local_30;
  SVGElement *parent;
  Transform transform;
  Element *this_local;
  
  transform.m_matrix._16_8_ = this;
  if ((this->super_Node).m_node == (SVGNode *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    Matrix::Matrix(__return_storage_ptr__);
  }
  else {
    pSVar1 = element(this,true);
    (*(pSVar1->super_SVGNode)._vptr_SVGNode[10])(&parent);
    pSVar1 = element(this,false);
    for (local_30 = SVGNode::parentElement(&pSVar1->super_SVGNode); local_30 != (SVGElement *)0x0;
        local_30 = SVGNode::parentElement(&local_30->super_SVGNode)) {
      (*(local_30->super_SVGNode)._vptr_SVGNode[10])(&local_48);
      Transform::postMultiply((Transform *)&parent,&local_48);
    }
    Matrix::Matrix(__return_storage_ptr__,(Transform *)&parent);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Element::getGlobalMatrix() const
{
    if(m_node == nullptr)
        return Matrix();
    auto transform = element(true)->localTransform();
    for(auto parent = element()->parentElement(); parent; parent = parent->parentElement())
        transform.postMultiply(parent->localTransform());
    return transform;
}